

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

string * __thiscall
BasePort::GetFpgaVersionMajorString_abi_cxx11_
          (string *__return_storage_ptr__,BasePort *this,uchar boardId)

{
  allocator<char> local_22;
  undefined1 local_21;
  uint local_20;
  uchar local_19;
  uint fpga_ver;
  uchar boardId_local;
  BasePort *this_local;
  string *fStr;
  
  local_19 = boardId;
  _fpga_ver = this;
  this_local = (BasePort *)__return_storage_ptr__;
  local_20 = GetFpgaVersionMajor(this,boardId);
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"FPGA_V",&local_22);
  std::allocator<char>::~allocator(&local_22);
  if (local_20 == 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::GetFpgaVersionMajorString(unsigned char boardId) const
{
    unsigned int fpga_ver = GetFpgaVersionMajor(boardId);
    std::string fStr("FPGA_V");
    if (fpga_ver == 0)
        fStr.push_back('?');
    else
        fStr.push_back('0'+fpga_ver);
    return fStr;
}